

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<duckdb::LogicalType,duckdb::LogicalType,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,LogicalType *param,LogicalType *params,unsigned_long params_1)

{
  LogicalType *params_00;
  LogicalType LStack_98;
  LogicalType local_80;
  undefined1 local_68 [56];
  
  params_00 = params;
  LogicalType::LogicalType(&local_80,(LogicalType *)values);
  ExceptionFormatValue::CreateFormatValue<duckdb::LogicalType>
            ((ExceptionFormatValue *)local_68,&local_80);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)local_68);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x18));
  LogicalType::~LogicalType(&local_80);
  LogicalType::LogicalType(&LStack_98,param);
  ConstructMessageRecursive<duckdb::LogicalType,unsigned_long>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &LStack_98,params,(unsigned_long)params_00);
  LogicalType::~LogicalType(&LStack_98);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}